

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecureRandomDataProvider.cc
# Opt level: O2

void __thiscall
SecureRandomDataProvider::provideRandomData(SecureRandomDataProvider *this,uchar *data,size_t len)

{
  int iVar1;
  size_t sVar2;
  runtime_error *prVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (provideRandomData(unsigned_char*,unsigned_long)::random_device == '\0') {
    iVar1 = __cxa_guard_acquire(&provideRandomData(unsigned_char*,unsigned_long)::random_device);
    if (iVar1 != 0) {
      local_78._M_dataplus._M_p = (pointer)fopen("/dev/urandom","rb");
      if ((FILE *)local_78._M_dataplus._M_p == (FILE *)0x0) {
        local_78._M_dataplus._M_p = (pointer)fopen("/dev/arandom","rb");
        if ((FILE *)local_78._M_dataplus._M_p == (FILE *)0x0) {
          local_78._M_dataplus._M_p = (pointer)fopen("/dev/random","rb");
          if ((FILE *)local_78._M_dataplus._M_p == (FILE *)0x0) {
            prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (prVar3,"unable to find device in /dev for generating random numbers");
            __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
      }
      std::make_unique<QUtil::FileCloser,_IO_FILE*&>((_IO_FILE **)&provideRandomData::random_device)
      ;
      __cxa_atexit(std::unique_ptr<QUtil::FileCloser,_std::default_delete<QUtil::FileCloser>_>::
                   ~unique_ptr,&provideRandomData::random_device,&__dso_handle);
      __cxa_guard_release(&provideRandomData(unsigned_char*,unsigned_long)::random_device);
    }
  }
  sVar2 = fread(data,1,len,
                *(FILE **)provideRandomData::random_device._M_t.
                          super___uniq_ptr_impl<QUtil::FileCloser,_std::default_delete<QUtil::FileCloser>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_QUtil::FileCloser_*,_std::default_delete<QUtil::FileCloser>_>
                          .super__Head_base<0UL,_QUtil::FileCloser_*,_false>._M_head_impl);
  if (sVar2 == len) {
    return;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_58,len);
  std::operator+(&local_38,"unable to read ",&local_58);
  std::operator+(&local_78,&local_38," bytes from random number device");
  std::runtime_error::runtime_error(prVar3,(string *)&local_78);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
SecureRandomDataProvider::provideRandomData(unsigned char* data, size_t len)
{
# if defined(_WIN32)

    // Optimization: make the WindowsCryptProvider static as long as
    // it can be done in a thread-safe fashion.
    WindowsCryptProvider c;
    if (!CryptGenRandom(c.crypt_prov, static_cast<DWORD>(len), reinterpret_cast<BYTE*>(data))) {
        throw std::runtime_error("unable to generate secure random data");
    }

# else
    static std::unique_ptr<QUtil::FileCloser> random_device = []() {
        FILE* f = fopen("/dev/urandom", "rb");
        if (f == nullptr) {
            f = fopen("/dev/arandom", "rb");
        }
        if (f == nullptr) {
            f = fopen("/dev/random", "rb");
        }
        if (f == nullptr) {
            throw std::runtime_error("unable to find device in /dev for generating random numbers");
        }
        return std::make_unique<QUtil::FileCloser>(f);
    }();

    size_t fr = fread(data, 1, len, random_device->f);
    if (fr != len) {
        throw std::runtime_error(
            "unable to read " + std::to_string(len) + " bytes from random number device");
    }

# endif
}